

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

BackgroundData * qvariant_cast<QCss::BackgroundData>(QVariant *v)

{
  long lVar1;
  bool bVar2;
  QMetaType QVar3;
  QMetaType *pQVar4;
  void *pvVar5;
  BackgroundData *in_RDI;
  long in_FS_OFFSET;
  BackgroundData *t;
  QMetaType targetType;
  BackgroundData *in_stack_ffffffffffffffa8;
  BackgroundData *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QVar3 = QMetaType::fromType<QCss::BackgroundData>();
  QVariant::Private::type((Private *)this);
  bVar2 = operator==((QMetaType *)this,(QMetaType *)in_stack_ffffffffffffffa8);
  if (bVar2) {
    QVariant::Private::get<QCss::BackgroundData>((Private *)0xa3fda1);
    QCss::BackgroundData::BackgroundData(this,in_stack_ffffffffffffffa8);
  }
  else {
    memset(this,0xaa,0x30);
    QCss::BrushData::BrushData(&this->brush);
    QString::QString((QString *)0xa3fde4);
    this->repeat = Repeat_Unknown;
    memset(&this->alignment,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0xa3fe0d);
    pQVar4 = (QMetaType *)QVariant::metaType();
    pvVar5 = QVariant::constData((QVariant *)0xa3fe26);
    QMetaType::convert(pQVar4,pvVar5,(QMetaType *)QVar3.d_ptr,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}